

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall
wallet::CWallet::AddToWalletIfInvolvingMe
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool fUpdate,
          bool rescanning_old_block)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_3;
  bool bVar1;
  ushort uVar2;
  _Optional_payload_base<bool> _Var3;
  size_type sVar4;
  pointer pCVar5;
  CAddressBookData *pCVar6;
  undefined8 uVar7;
  CWalletTx *pCVar8;
  runtime_error *this_00;
  undefined4 uVar9;
  undefined7 in_register_00000009;
  pointer __k;
  undefined4 uVar11;
  undefined7 in_register_00000081;
  _Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> __tmp;
  _Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> _Var12;
  base_blob<256u> *this_01;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var13;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  pVar14;
  CTransactionRef tx;
  undefined1 rescanning_old_block_00;
  undefined4 in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe6c [12];
  CScript *script;
  base_blob<256u> *this_02;
  pointer pCVar15;
  base_blob<256u> *pbVar16;
  undefined1 fFlushOnClose;
  byte bVar17;
  element_type *tx_00;
  SyncTxState *pSVar18;
  _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  *this_03;
  pointer pCVar19;
  pointer in_stack_fffffffffffffec0;
  undefined1 in_stack_fffffffffffffec8 [16];
  pointer in_stack_fffffffffffffed8;
  pointer pWVar20;
  pointer in_stack_fffffffffffffee0;
  pointer pWVar21;
  _Storage<wallet::AddressPurpose,_true> local_110;
  undefined1 local_10c;
  undefined1 local_108 [32];
  TxState tx_state;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> _Var10;
  
  uVar11 = (undefined4)CONCAT71(in_register_00000081,rescanning_old_block);
  uVar9 = (undefined4)CONCAT71(in_register_00000009,fUpdate);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  tx_00 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pSVar18 = state;
  if ((state->
      super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ).
      super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      .
      super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
      ._M_index == '\0') {
    pCVar19 = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
              super__Vector_impl_data._M_finish;
    this_03 = &(this->mapTxSpends)._M_h;
    this_01 = (base_blob<256u> *)&tx_00->hash;
    pbVar16 = this_01;
    for (__k = (tx_00->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start; __k != pCVar19; __k = __k + 1) {
      pVar14 = std::
               _Hashtable<COutPoint,_std::pair<const_COutPoint,_uint256>,_std::allocator<std::pair<const_COutPoint,_uint256>_>,_std::__detail::_Select1st,_std::equal_to<COutPoint>,_SaltedOutpointHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
               ::equal_range(this_03,&__k->prevout);
      _Var10._M_cur =
           (__node_type *)
           pVar14.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
           _M_cur;
      while( true ) {
        _Var13._M_cur =
             (__node_type *)
             pVar14.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
             _M_cur;
        _Var12 = pVar14.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                 _M_cur;
        if (_Var12.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur ==
            (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var13._M_cur) break;
        this_02 = (base_blob<256u> *)
                  ((long)_Var12.
                         super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                         _M_cur + 0x2c);
        bVar1 = operator!=((base_blob<256U> *)this_02,(base_blob<256U> *)this_01);
        if (bVar1) {
          base_blob<256u>::ToString_abi_cxx11_(&local_58,this_01);
          base_blob<256u>::ToString_abi_cxx11_(&local_78,(base_blob<256u> *)state);
          base_blob<256u>::ToString_abi_cxx11_(&local_98,this_02);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_b8,
                     (base_blob<256u> *)
                     ((long)_Var12.
                            super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                            _M_cur + 8));
          in_stack_fffffffffffffe68 =
               *(undefined4 *)
                ((long)_Var12.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>.
                       _M_cur + 0x28);
          parameters._4_12_ = in_stack_fffffffffffffe6c;
          parameters._M_dataplus._M_p._0_4_ = in_stack_fffffffffffffe68;
          parameters.field_2._M_allocated_capacity = (size_type)this_02;
          parameters.field_2._8_8_ = pbVar16;
          parameters_1._M_string_length._0_4_ = uVar11;
          parameters_1._M_dataplus._M_p = (pointer)_Var10._M_cur;
          parameters_1._M_string_length._4_4_ = uVar9;
          parameters_1.field_2._M_allocated_capacity = (size_type)tx_00;
          parameters_1.field_2._8_8_ = pSVar18;
          parameters_2._M_string_length = (size_type)pCVar19;
          parameters_2._M_dataplus._M_p = (pointer)this_03;
          parameters_2.field_2._M_allocated_capacity = (size_type)__k;
          parameters_2.field_2._8_8_ = in_stack_fffffffffffffec0;
          parameters_3.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffffed8;
          parameters_3._M_dataplus._M_p = (pointer)in_stack_fffffffffffffec8._0_8_;
          parameters_3._M_string_length = in_stack_fffffffffffffec8._8_8_;
          parameters_3.field_2._8_8_ = in_stack_fffffffffffffee0;
          WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                    (this,
                     "Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n"
                     ,parameters,parameters_1,parameters_2,parameters_3,(uint)&local_58);
          std::__cxx11::string::~string((string *)&local_b8);
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
          this_01 = pbVar16;
          _Var13._M_cur = _Var10._M_cur;
          MarkConflicted(this,(uint256 *)state,
                         *(int *)((long)&(pSVar18->
                                         super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         ).
                                         super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         .
                                         super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                                         ._M_u + 0x20),(uint256 *)this_02);
          pbVar16 = this_01;
          _Var10._M_cur = _Var13._M_cur;
        }
        pVar14.second.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
             (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)_Var13._M_cur;
        pVar14.first.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur =
             (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>)
             (__node_type *)
             *(_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
              _Var12.super__Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false>._M_cur;
      }
    }
  }
  bVar17 = (byte)uVar9;
  sVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::count(&(this->mapWallet)._M_h,&(tx_00->hash).m_wrapped);
  if (((sVar4 != 0 & (bVar17 ^ 1)) == 0) &&
     (((sVar4 != 0 || (bVar1 = IsMine(this,tx_00), bVar1)) || (bVar1 = IsFromMe(this,tx_00), bVar1))
     )) {
    pCVar5 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar15 = (tx_00->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
              super__Vector_impl_data._M_finish;
    while( true ) {
      rescanning_old_block_00 = (undefined1)in_stack_fffffffffffffe68;
      fFlushOnClose = (undefined1)uVar11;
      if (pCVar5 == pCVar15) break;
      script = &pCVar5->scriptPubKey;
      GetScriptPubKeyMans((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                           *)&tx_state,this,script);
      uVar7 = tx_state.
              super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              .
              super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
              ._M_u._24_8_;
      while ((_Rb_tree_node_base *)uVar7 !=
             (_Rb_tree_node_base *)
             ((long)&tx_state.
                     super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     .
                     super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     .
                     super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     .
                     super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     .
                     super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     .
                     super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                     ._M_u + 8)) {
        (**(code **)(**(long **)(uVar7 + 0x20) + 0x50))
                  ((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
                   &stack0xfffffffffffffed8,*(long **)(uVar7 + 0x20),script);
        pWVar20 = in_stack_fffffffffffffed8;
        pWVar21 = in_stack_fffffffffffffee0;
        for (; in_stack_fffffffffffffed8 != in_stack_fffffffffffffee0;
            in_stack_fffffffffffffed8 = in_stack_fffffffffffffed8 + 1) {
          bVar1 = (in_stack_fffffffffffffed8->internal).super__Optional_base<bool,_true,_true>.
                  _M_payload.super__Optional_payload_base<bool>._M_engaged;
          uVar2 = (ushort)bVar1;
          if (bVar1 == false) {
            _Var3 = (_Optional_payload_base<bool>)
                    IsInternalScriptPubKeyMan(this,*(ScriptPubKeyMan **)(uVar7 + 0x20));
            (in_stack_fffffffffffffed8->internal).super__Optional_base<bool,_true,_true>._M_payload.
            super__Optional_payload_base<bool> = _Var3;
            uVar2 = (ushort)_Var3 >> 8;
          }
          if ((((uVar2 & 1) != 0) &&
              ((in_stack_fffffffffffffed8->internal).super__Optional_base<bool,_true,_true>.
               _M_payload.super__Optional_payload_base<bool>._M_payload._M_value == false)) &&
             (pCVar6 = FindAddressBookEntry(this,&in_stack_fffffffffffffed8->dest,false),
             pCVar6 == (CAddressBookData *)0x0)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_108,"",(allocator<char> *)&stack0xfffffffffffffed7);
            local_110._M_value = RECEIVE;
            local_10c = 1;
            SetAddressBook(this,&in_stack_fffffffffffffed8->dest,(string *)local_108,
                           (optional<wallet::AddressPurpose> *)&local_110);
            std::__cxx11::string::~string((string *)local_108);
          }
        }
        std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::~vector
                  ((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
                   &stack0xfffffffffffffed8);
        uVar7 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar7);
        in_stack_fffffffffffffed8 = pWVar20;
        in_stack_fffffffffffffee0 = pWVar21;
      }
      std::
      _Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
      ::~_Rb_tree((_Rb_tree<wallet::ScriptPubKeyMan_*,_wallet::ScriptPubKeyMan_*,_std::_Identity<wallet::ScriptPubKeyMan_*>,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                   *)&tx_state);
      pCVar5 = pCVar5 + 1;
    }
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp:1279:43)_&&,_const_std::variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>_&>
      ::_S_vtable._M_arr
      [(pSVar18->
       super__Variant_base<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ).
       super__Move_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_assign_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Move_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Copy_ctor_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       .
       super__Variant_storage_alias<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
       ._M_index]._M_data)
              ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateBlockConflicted,_wallet::TxStateInactive,_wallet::TxStateUnrecognized>
                *)&tx_state,(anon_class_1_0_00000001 *)local_108,pSVar18);
    std::make_shared<CTransaction_const,CTransaction_const&>
              ((CTransaction *)&stack0xfffffffffffffec0);
    local_108._16_8_ = 0;
    local_108._24_8_ = 0;
    local_108._0_8_ = (pointer)0x0;
    local_108._8_8_ = 0;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&tx_state;
    tx.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (CTransaction *)&stack0xfffffffffffffec0;
    pCVar8 = AddToWallet(this,tx,(TxState *)local_108,(UpdateWalletTxFn *)0x0,(bool)fFlushOnClose,
                         (bool)rescanning_old_block_00);
    std::_Function_base::~_Function_base((_Function_base *)local_108);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffec8);
    if (pCVar8 == (CWalletTx *)0x0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (this_00,"DB error adding transaction to wallet, write failed");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      goto LAB_00149ddb;
    }
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
LAB_00149ddb:
  __stack_chk_fail();
}

Assistant:

bool CWallet::AddToWalletIfInvolvingMe(const CTransactionRef& ptx, const SyncTxState& state, bool fUpdate, bool rescanning_old_block)
{
    const CTransaction& tx = *ptx;
    {
        AssertLockHeld(cs_wallet);

        if (auto* conf = std::get_if<TxStateConfirmed>(&state)) {
            for (const CTxIn& txin : tx.vin) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(txin.prevout);
                while (range.first != range.second) {
                    if (range.first->second != tx.GetHash()) {
                        WalletLogPrintf("Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n", tx.GetHash().ToString(), conf->confirmed_block_hash.ToString(), range.first->second.ToString(), range.first->first.hash.ToString(), range.first->first.n);
                        MarkConflicted(conf->confirmed_block_hash, conf->confirmed_block_height, range.first->second);
                    }
                    range.first++;
                }
            }
        }

        bool fExisted = mapWallet.count(tx.GetHash()) != 0;
        if (fExisted && !fUpdate) return false;
        if (fExisted || IsMine(tx) || IsFromMe(tx))
        {
            /* Check if any keys in the wallet keypool that were supposed to be unused
             * have appeared in a new transaction. If so, remove those keys from the keypool.
             * This can happen when restoring an old wallet backup that does not contain
             * the mostly recently created transactions from newer versions of the wallet.
             */

            // loop though all outputs
            for (const CTxOut& txout: tx.vout) {
                for (const auto& spk_man : GetScriptPubKeyMans(txout.scriptPubKey)) {
                    for (auto &dest : spk_man->MarkUnusedAddresses(txout.scriptPubKey)) {
                        // If internal flag is not defined try to infer it from the ScriptPubKeyMan
                        if (!dest.internal.has_value()) {
                            dest.internal = IsInternalScriptPubKeyMan(spk_man);
                        }

                        // skip if can't determine whether it's a receiving address or not
                        if (!dest.internal.has_value()) continue;

                        // If this is a receiving address and it's not in the address book yet
                        // (e.g. it wasn't generated on this node or we're restoring from backup)
                        // add it to the address book for proper transaction accounting
                        if (!*dest.internal && !FindAddressBookEntry(dest.dest, /* allow_change= */ false)) {
                            SetAddressBook(dest.dest, "", AddressPurpose::RECEIVE);
                        }
                    }
                }
            }

            // Block disconnection override an abandoned tx as unconfirmed
            // which means user may have to call abandontransaction again
            TxState tx_state = std::visit([](auto&& s) -> TxState { return s; }, state);
            CWalletTx* wtx = AddToWallet(MakeTransactionRef(tx), tx_state, /*update_wtx=*/nullptr, /*fFlushOnClose=*/false, rescanning_old_block);
            if (!wtx) {
                // Can only be nullptr if there was a db write error (missing db, read-only db or a db engine internal writing error).
                // As we only store arriving transaction in this process, and we don't want an inconsistent state, let's throw an error.
                throw std::runtime_error("DB error adding transaction to wallet, write failed");
            }
            return true;
        }
    }
    return false;
}